

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O2

int hashtable_del(hashtable_t *hashtable,char *key)

{
  hashtable_list *phVar1;
  uint32_t uVar2;
  size_t length;
  pair_t *ptr;
  hashtable_list *phVar3;
  int iVar4;
  bucket_t *bucket;
  
  length = strlen(key);
  uVar2 = hashlittle(key,length,hashtable_seed);
  iVar4 = -1;
  bucket = hashtable->buckets + (~(-1 << ((byte)hashtable->order & 0x1f)) & uVar2);
  ptr = hashtable_find_pair(hashtable,bucket,key,(ulong)uVar2);
  if (ptr != (pair_t *)0x0) {
    if (ptr == (pair_t *)bucket->first) {
      if (ptr == (pair_t *)bucket->last) {
        phVar3 = &hashtable->list;
        bucket->last = phVar3;
      }
      else {
        phVar3 = (ptr->list).next;
      }
      bucket->first = phVar3;
    }
    else if (ptr == (pair_t *)bucket->last) {
      bucket->last = (ptr->list).prev;
    }
    phVar3 = (ptr->list).prev;
    phVar1 = (ptr->list).next;
    phVar3->next = phVar1;
    phVar1->prev = phVar3;
    phVar3 = (ptr->ordered_list).prev;
    phVar1 = (ptr->ordered_list).next;
    phVar3->next = phVar1;
    phVar1->prev = phVar3;
    json_decref(ptr->value);
    jsonp_free(ptr);
    hashtable->size = hashtable->size - 1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int hashtable_del(hashtable_t *hashtable, const char *key)
{
    size_t hash = hash_str(key);
    return hashtable_do_del(hashtable, key, hash);
}